

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void exchangeObjects(object *array1,object *array2,int size)

{
  long lVar1;
  object **oop;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  walk(memoryPointer,memoryTop,array1,array2,size);
  walk(staticPointer,staticTop,array1,array2,size);
  lVar3 = (long)rootTop;
  oop = rootStack;
  for (lVar1 = 0; lVar1 < lVar3; lVar1 = lVar1 + 1) {
    map(oop,array1,array2,size);
    oop = oop + 1;
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)staticRootTop;
  if (staticRootTop < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 8 != uVar4; uVar4 = uVar4 + 8) {
    map(*(object ***)((long)staticRoots + uVar4),array1,array2,size);
  }
  return;
}

Assistant:

void exchangeObjects(struct object *array1, struct object *array2, int size)
{
    int x;

    /*
     * Convert our memory spaces
     */
    walk(memoryPointer, memoryTop, array1, array2, size);
    walk(staticPointer, staticTop, array1, array2, size);

    /*
     * Fix up the root pointers, too
     */
    for (x = 0; x < rootTop; x++) {
        map(&rootStack[x], array1, array2, size);
    }
    for (x = 0; x < staticRootTop; x++) {
        map(staticRoots[x], array1, array2, size);
    }
}